

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hh
# Opt level: O1

void __thiscall
tchecker::pool_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>::
destruct_all(pool_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_> *this
            )

{
  size_t sVar1;
  char *pcVar2;
  long *plVar3;
  char *pcVar4;
  
  pcVar4 = this->_block_head;
  do {
    if (pcVar4 == (char *)0x0) {
      pcVar4 = this->_block_head;
      while (pcVar4 != (char *)0x0) {
        pcVar2 = *(char **)pcVar4;
        operator_delete__(pcVar4);
        pcVar4 = pcVar2;
      }
      this->_block_head = (char *)0x0;
      this->_raw_head = (char *)0x0;
      this->_blocks_count = 0;
      this->_free_head = (char *)0x0;
      this->_raw_end = (char *)0x0;
      return;
    }
    sVar1 = this->_block_size;
    if (sVar1 != 8) {
      plVar3 = (long *)(pcVar4 + 8);
      do {
        if ((this->_raw_head <= plVar3) && (plVar3 < this->_raw_end)) break;
        if (*plVar3 != -1) {
          if (*plVar3 != 0) {
            __assert_fail("*refcount == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/pool.hh"
                          ,0x10b,
                          "void tchecker::pool_t<tchecker::make_shared_t<tchecker::syncprod::state_t>>::destruct_all() [T = tchecker::make_shared_t<tchecker::syncprod::state_t>]"
                         );
          }
          *plVar3 = -1;
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
          ~intrusive_shared_ptr_t
                    ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
                      *)(plVar3 + 1));
        }
        plVar3 = (long *)((long)plVar3 + this->_alloc_size);
      } while (plVar3 != (long *)(pcVar4 + sVar1));
    }
    pcVar4 = *(char **)pcVar4;
  } while( true );
}

Assistant:

void destruct_all()
  {
    // Call destructor on all chunks in blocks list that
    // - are not in free list
    // - are not in raw block
    for (void * block = _block_head; block != nullptr; block = nextblock(block)) {
      void * block_end = static_cast<char *>(block) + _block_size;

      for (char * chunk = first_chunk_ptr(block); chunk != block_end; chunk += _alloc_size) {
        // Ignore chunks inside unused raw block
        if ((_raw_head <= chunk) && (chunk < _raw_end))
          break;

        // Destruct all chunks that are not free
        typename T::refcount_t * refcount = reinterpret_cast<typename T::refcount_t *>(chunk);

        if (*refcount > T::REFCOUNT_MAX)
          continue;

        assert(*refcount == 0);
        // make the chunk free using its refcount
        *refcount = FREE_CHUNK;
        // destruct the object in the chunk
        T * t = reinterpret_cast<T *>(refcount + 1);
        T::destruct(t); // t->~T();
      }
    }

    // Free memory
    free_all();
  }